

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Node::traverseAnnotations
          (Node *this,Reader *annotations,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ElementCount EVar1;
  iterator iVar2;
  ElementCount index;
  Reader annotation;
  key_type local_68;
  StructReader local_60;
  
  EVar1 = (annotations->reader).elementCount;
  if (EVar1 != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_60,&annotations->reader,index);
      if (local_60.dataSize < 0x40) {
        local_68 = 0;
      }
      else {
        local_68 = *local_60.data;
      }
      iVar2 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->module->compiler->nodesById)._M_h,&local_68);
      if ((iVar2.
           super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (*(Node **)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                           ._M_cur + 0x10) != (Node *)0x0)) {
        traverse(*(Node **)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                  ._M_cur + 0x10),eagerness,seen,finalLoader,sourceInfo);
      }
      index = index + 1;
    } while (EVar1 != index);
  }
  return;
}

Assistant:

void Compiler::Node::traverseAnnotations(const List<schema::Annotation>::Reader& annotations,
                                         uint eagerness,
                                         std::unordered_map<Node*, uint>& seen,
                                         const SchemaLoader& finalLoader,
                                         kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto annotation: annotations) {
    KJ_IF_MAYBE(node, module->getCompiler().findNode(annotation.getId())) {
      node->traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }
}